

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

bool __thiscall VcprojGenerator::isStandardSuffix(VcprojGenerator *this,QString *suffix)

{
  QMakeProject *pQVar1;
  long lVar2;
  Data *pDVar3;
  int iVar4;
  ProStringList *pPVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView config;
  QArrayData *local_88;
  storage_type_conflict *psStack_80;
  qsizetype local_78;
  ProKey local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_68,"QMAKE_APP_FLAG");
  pPVar5 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_68);
  lVar2 = (pPVar5->super_QList<ProString>).d.size;
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 == 0) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar6.m_data = (storage_type *)0x6;
    QVar6.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar6);
    pDVar3 = local_68.super_ProString.m_string.d.d;
    config.m_data = local_68.super_ProString.m_string.d.ptr;
    config.m_size = local_68.super_ProString.m_string.d.size;
    QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
  }
  QVar7.m_data = (storage_type *)0x3;
  QVar7.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar7);
  local_88 = &(local_68.super_ProString.m_string.d.d)->super_QArrayData;
  psStack_80 = local_68.super_ProString.m_string.d.ptr;
  local_78 = local_68.super_ProString.m_string.d.size;
  iVar4 = QString::compare((QString *)suffix,(CaseSensitivity)&local_88);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar4 == 0;
}

Assistant:

bool VcprojGenerator::isStandardSuffix(const QString &suffix) const
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if (suffix.compare("exe", Qt::CaseInsensitive) == 0)
            return true;
    } else if (project->isActiveConfig("shared")) {
        if (suffix.compare("dll", Qt::CaseInsensitive) == 0)
            return true;
    } else {
        if (suffix.compare("lib", Qt::CaseInsensitive) == 0)
            return true;
    }
    return false;
}